

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * ot::commissioner::internal::DecodeModeData
                  (Error *__return_storage_ptr__,ModeData *aModeData,ByteArray *aBuf)

{
  char cVar1;
  byte *pbVar2;
  char *from;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  long lVar3;
  string_view fmt;
  format_args args;
  writer write;
  string local_b0;
  undefined1 local_90 [40];
  format_string_checker<char> local_68;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  pbVar2 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pbVar2;
  if (lVar3 == 1) {
    aModeData->mIsRxOnWhenIdleMode = (bool)(*pbVar2 & 1);
    aModeData->mIsMtd = (*pbVar2 & 2) == 0;
    aModeData->mIsStableNetworkDataRequired = (bool)(*pbVar2 >> 2 & 1);
  }
  else {
    local_68.types_[0] = ulong_long_type;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "invalid Mode value length {}, expect 1";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x26;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 1;
    local_68.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    from = "invalid Mode value length {}, expect 1";
    write.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    while (from != "") {
      cVar1 = *from;
      to = from;
      while (cVar1 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long>_>
          ::writer::operator()(&write,from,"");
          goto LAB_0017a706;
        }
        cVar1 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long>_>
      ::writer::operator()(&write,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_long>&>
                       (to,"",&local_68);
    }
LAB_0017a706:
    fmt.size_ = 4;
    fmt.data_ = (char *)0x26;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    local_68._0_8_ = lVar3;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b0,(v10 *)"invalid Mode value length {}, expect 1",fmt,args);
    local_90._0_4_ = kBadFormat;
    std::__cxx11::string::string((string *)(local_90 + 8),(string *)&local_b0);
    Error::operator=(__return_storage_ptr__,(Error *)local_90);
    std::__cxx11::string::~string((string *)(local_90 + 8));
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

Error internal::DecodeModeData(ModeData &aModeData, const ByteArray &aBuf)
{
    Error  error;
    size_t length = aBuf.size();
    VerifyOrExit(length == 1, error = ERROR_BAD_FORMAT("invalid Mode value length {}, expect 1", length));
    aModeData.mIsRxOnWhenIdleMode          = (aBuf[0] & 0x01) != 0;
    aModeData.mIsMtd                       = (aBuf[0] & 0x02) == 0;
    aModeData.mIsStableNetworkDataRequired = (aBuf[0] & 0x04) != 0;

exit:
    return error;
}